

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O2

array<int,_6UL> * __thiscall
MeteomaticsApiClient::addDayToToday
          (array<int,_6UL> *__return_storage_ptr__,MeteomaticsApiClient *this,int days)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  time_t later_time;
  time_t ltime;
  time_t local_20;
  long local_18;
  
  local_18 = std::chrono::_V2::system_clock::now();
  local_18 = local_18 / 1000000000;
  ptVar6 = gmtime(&local_18);
  ptVar6->tm_mday = ptVar6->tm_mday + days;
  local_20 = mktime(ptVar6);
  ptVar6 = gmtime(&local_20);
  uVar1 = ptVar6->tm_mon;
  uVar2 = ptVar6->tm_year;
  *(ulong *)__return_storage_ptr__->_M_elems = CONCAT44(uVar1 + 1,uVar2 + 0x76c);
  iVar3 = ptVar6->tm_sec;
  iVar4 = ptVar6->tm_min;
  iVar5 = ptVar6->tm_hour;
  __return_storage_ptr__->_M_elems[2] = ptVar6->tm_mday;
  __return_storage_ptr__->_M_elems[3] = iVar5;
  __return_storage_ptr__->_M_elems[4] = iVar4;
  __return_storage_ptr__->_M_elems[5] = iVar3;
  return __return_storage_ptr__;
}

Assistant:

const std::array<int,6> MeteomaticsApiClient::addDayToToday(const int days) const
{
    std::time_t ltime = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
    struct tm *Tm;
    
    Tm=std::gmtime(&ltime);
    
    Tm->tm_mday += days;
    std::time_t later_time = mktime(Tm);
    Tm=std::gmtime(&later_time);
    
    std::array<int,6> tomorrows_time;
    tomorrows_time[0] = Tm->tm_year+1900;
    tomorrows_time[1] = Tm->tm_mon+1;
    tomorrows_time[2] = Tm->tm_mday;
    tomorrows_time[3] = Tm->tm_hour;
    tomorrows_time[4] = Tm->tm_min;
    tomorrows_time[5] = Tm->tm_sec;
    
    return tomorrows_time;
}